

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.cpp
# Opt level: O0

cppurses * __thiscall cppurses::to_string_abi_cxx11_(cppurses *this,Type type)

{
  allocator local_39;
  allocator local_38;
  allocator local_37;
  allocator local_36;
  allocator local_35;
  allocator local_34;
  allocator local_33;
  allocator local_32;
  allocator local_31;
  allocator local_30;
  allocator local_2f;
  allocator local_2e;
  allocator local_2d;
  allocator local_2c;
  allocator local_2b;
  allocator local_2a;
  allocator local_29;
  allocator local_28;
  allocator local_27;
  allocator local_26;
  allocator local_25 [16];
  allocator local_15;
  Type local_14;
  cppurses *pcStack_10;
  Type type_local;
  
  local_14 = type;
  pcStack_10 = this;
  switch(type) {
  case MouseButtonPress:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)this,"MouseButtonPress",&local_15);
    std::allocator<char>::~allocator((allocator<char> *)&local_15);
    break;
  case MouseButtonRelease:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)this,"MouseButtonRelease",local_25);
    std::allocator<char>::~allocator((allocator<char> *)local_25);
    break;
  case MouseButtonDblClick:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)this,"MouseButtonDblClick",&local_26);
    std::allocator<char>::~allocator((allocator<char> *)&local_26);
    break;
  case MouseWheel:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)this,"MouseWheel",&local_27);
    std::allocator<char>::~allocator((allocator<char> *)&local_27);
    break;
  case MouseMove:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)this,"MouseMove",&local_28);
    std::allocator<char>::~allocator((allocator<char> *)&local_28);
    break;
  case KeyPress:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)this,"KeyPress",&local_29);
    std::allocator<char>::~allocator((allocator<char> *)&local_29);
    break;
  case KeyRelease:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)this,"KeyRelease",&local_2a);
    std::allocator<char>::~allocator((allocator<char> *)&local_2a);
    break;
  case FocusIn:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)this,"FocusIn",&local_2b);
    std::allocator<char>::~allocator((allocator<char> *)&local_2b);
    break;
  case FocusOut:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)this,"FocusOut",&local_2c);
    std::allocator<char>::~allocator((allocator<char> *)&local_2c);
    break;
  case Paint:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)this,"Paint",&local_2d);
    std::allocator<char>::~allocator((allocator<char> *)&local_2d);
    break;
  case Move:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)this,"Move",&local_2e);
    std::allocator<char>::~allocator((allocator<char> *)&local_2e);
    break;
  case Resize:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)this,"Resize",&local_2f);
    std::allocator<char>::~allocator((allocator<char> *)&local_2f);
    break;
  case TerminalResize:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)this,"TerminalResize",&local_30);
    std::allocator<char>::~allocator((allocator<char> *)&local_30);
    break;
  case ChildAdded:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)this,"ChildAdded",&local_31);
    std::allocator<char>::~allocator((allocator<char> *)&local_31);
    break;
  case ChildRemoved:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)this,"ChildRemoved",&local_32);
    std::allocator<char>::~allocator((allocator<char> *)&local_32);
    break;
  case ChildPolished:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)this,"ChildPolished",&local_33);
    std::allocator<char>::~allocator((allocator<char> *)&local_33);
    break;
  case Enable:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)this,"Enable",&local_34);
    std::allocator<char>::~allocator((allocator<char> *)&local_34);
    break;
  case Disable:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)this,"Disable",&local_35);
    std::allocator<char>::~allocator((allocator<char> *)&local_35);
    break;
  case Delete:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)this,"Delete",&local_36);
    std::allocator<char>::~allocator((allocator<char> *)&local_36);
    break;
  case Timer:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)this,"Timer",&local_37);
    std::allocator<char>::~allocator((allocator<char> *)&local_37);
    break;
  case Custom:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)this,"Custom",&local_38);
    std::allocator<char>::~allocator((allocator<char> *)&local_38);
    break;
  default:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)this,"None",&local_39);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
  }
  return this;
}

Assistant:

auto to_string(Event::Type type) -> std::string
{
    switch (type) {
        case Event::MouseButtonPress: return "MouseButtonPress";
        case Event::MouseButtonRelease: return "MouseButtonRelease";
        case Event::MouseButtonDblClick: return "MouseButtonDblClick";
        case Event::MouseWheel: return "MouseWheel";
        case Event::MouseMove: return "MouseMove";
        case Event::KeyPress: return "KeyPress";
        case Event::KeyRelease: return "KeyRelease";
        case Event::FocusIn: return "FocusIn";
        case Event::FocusOut: return "FocusOut";
        case Event::Paint: return "Paint";
        case Event::Move: return "Move";
        case Event::Resize: return "Resize";
        case Event::TerminalResize: return "TerminalResize";
        case Event::ChildAdded: return "ChildAdded";
        case Event::ChildRemoved: return "ChildRemoved";
        case Event::ChildPolished: return "ChildPolished";
        case Event::Enable: return "Enable";
        case Event::Disable: return "Disable";
        case Event::Delete: return "Delete";
        case Event::Timer: return "Timer";
        case Event::Custom: return "Custom";
        default: return "None";
    }
}